

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int test_5_3_1::del_hash(int *h,int k,int n)

{
  int iVar1;
  string *this;
  int d;
  int iVar2;
  allocator local_49;
  string local_48;
  string local_28;
  
  if (h[k % 7] == k) {
    std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_21f9,&local_49);
    iVar2 = 1;
    errCode(&local_28,1);
    this = &local_28;
LAB_001031d5:
    std::__cxx11::string::~string((string *)this);
  }
  else {
    iVar2 = 1;
    do {
      if (n <= iVar2) {
        std::__cxx11::string::string((string *)&local_48,anon_var_dwarf_21ee,&local_49);
        iVar2 = 0;
        errCode(&local_48,0);
        this = &local_48;
        goto LAB_001031d5;
      }
      iVar1 = (k % 7 + iVar2) % 7;
      iVar2 = iVar2 + 1;
    } while (h[iVar1] != k);
    h[iVar1] = -1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int del_hash(int *h, int k, int n) {
        int i = k % 7;
        if (h[i] == INTMAX_MAX)
            return errCode("没有这个关键字", 0);
        if (h[i] == k) {
            h[i] == INTMAX_MAX;
            return errCode("删除成功", 1);
        } else {
            int j = i;
            for (int d = 1; d <= n - 1; d++) {
                i = (j + d) % 7;
                if (h[i] == INTMAX_MAX)
                    return 0;
                if (h[i] == k) {
                    h[i] = INTMAX_MAX;
                    return 1;
                }
            }
            return errCode("没有这个关键字", 0);
        }
    }